

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O1

PropertyQueryFlags __thiscall
Js::JavascriptFunction::HasPropertyQuery
          (JavascriptFunction *this,PropertyId propertyId,PropertyValueInfo *info)

{
  bool bVar1;
  PropertyQueryFlags PVar2;
  
  if ((propertyId | 2U) == 0x1cf) {
    bVar1 = HasRestrictedProperties(this);
    if (bVar1) {
      return Property_Found;
    }
  }
  PVar2 = DynamicObject::HasPropertyQuery(&this->super_DynamicObject,propertyId,info);
  return PVar2;
}

Assistant:

PropertyQueryFlags JavascriptFunction::HasPropertyQuery(PropertyId propertyId, _Inout_opt_ PropertyValueInfo* info)
    {
        switch (propertyId)
        {
        case PropertyIds::caller:
        case PropertyIds::arguments:
            if (this->HasRestrictedProperties())
            {
                return PropertyQueryFlags::Property_Found;
            }
            break;
        }
        return DynamicObject::HasPropertyQuery(propertyId, info);
    }